

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O0

wchar_t yes(char *fmt,...)

{
  byte bVar1;
  char in_AL;
  ushort **ppuVar2;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  char *in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list ap;
  ssize_t l;
  char *p;
  char buff [32];
  undefined1 local_118 [8];
  undefined8 local_110;
  undefined8 local_108;
  undefined8 local_100;
  undefined8 local_f8;
  undefined8 local_f0;
  undefined8 local_e8;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined4 local_68;
  undefined4 local_64;
  undefined1 *local_60;
  undefined1 *local_58;
  ssize_t local_48;
  byte *local_40;
  byte local_38 [40];
  char *local_10;
  
  if (in_AL != '\0') {
    local_e8 = in_XMM0_Qa;
    local_d8 = in_XMM1_Qa;
    local_c8 = in_XMM2_Qa;
    local_b8 = in_XMM3_Qa;
    local_a8 = in_XMM4_Qa;
    local_98 = in_XMM5_Qa;
    local_88 = in_XMM6_Qa;
    local_78 = in_XMM7_Qa;
  }
  local_58 = local_118;
  local_60 = &stack0x00000008;
  local_64 = 0x30;
  local_68 = 8;
  local_110 = in_RSI;
  local_108 = in_RDX;
  local_100 = in_RCX;
  local_f8 = in_R8;
  local_f0 = in_R9;
  local_10 = in_RDI;
  vfprintf(_stderr,in_RDI,&local_68);
  fprintf(_stderr," (y/N)? ");
  fflush(_stderr);
  local_48 = read(2,local_38,0x1f);
  if (local_48 < 0) {
    fprintf(_stderr,"Keyboard read failed\n");
    exit(1);
  }
  if (local_48 != 0) {
    local_38[local_48] = 0;
    for (local_40 = local_38; *local_40 != 0; local_40 = local_40 + 1) {
      ppuVar2 = __ctype_b_loc();
      if (((*ppuVar2)[(int)(uint)*local_40] & 0x2000) == 0) {
        bVar1 = *local_40;
        if (bVar1 == 0x4e) {
          return L'\0';
        }
        if (bVar1 != 0x59) {
          if (bVar1 == 0x6e) {
            return L'\0';
          }
          if (bVar1 != 0x79) {
            return L'\0';
          }
        }
        return L'\x01';
      }
    }
  }
  return L'\0';
}

Assistant:

int
yes(const char *fmt, ...)
{
	char buff[32];
	char *p;
	ssize_t l;

	va_list ap;
	va_start(ap, fmt);
	vfprintf(stderr, fmt, ap);
	va_end(ap);
	fprintf(stderr, " (y/N)? ");
	fflush(stderr);

	l = read(2, buff, sizeof(buff) - 1);
	if (l < 0) {
	  fprintf(stderr, "Keyboard read failed\n");
	  exit(1);
	}
	if (l == 0)
		return (0);
	buff[l] = 0;

	for (p = buff; *p != '\0'; p++) {
		if (isspace((unsigned char)*p))
			continue;
		switch(*p) {
		case 'y': case 'Y':
			return (1);
		case 'n': case 'N':
			return (0);
		default:
			return (0);
		}
	}

	return (0);
}